

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3SnippetAdvance(char **ppIter,i64 *piIter,int iNext)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  byte *p;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = (byte *)*ppIter;
  if (p != (byte *)0x0) {
    lVar4 = *piIter;
    if (lVar4 < iNext) {
      do {
        bVar1 = *p;
        if (bVar1 < 2) {
          lVar4 = -1;
          p = (byte *)0x0;
          break;
        }
        if ((char)bVar1 < '\0') {
          local_3c = 0xaaaaaaaa;
          uVar2 = sqlite3Fts3GetVarint32((char *)p,(int *)&local_3c);
          uVar3 = (ulong)uVar2;
          uVar2 = local_3c;
        }
        else {
          uVar3 = 1;
          uVar2 = (uint)bVar1;
        }
        p = p + uVar3;
        lVar4 = lVar4 + (int)uVar2 + -2;
      } while (lVar4 < iNext);
    }
    *piIter = lVar4;
    *ppIter = (char *)p;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, i64 *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    i64 iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}